

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

Channel * __thiscall
OPL::DOSBox::DBOPL::Channel::BlockTemplate<(OPL::DOSBox::DBOPL::SynthMode)10>
          (Channel *this,Chip *chip,Bit32u samples,Bit32s *output)

{
  Operator *pOVar1;
  uint local_2c;
  Bitu i;
  Bit32s *output_local;
  Bit32u samples_local;
  Chip *chip_local;
  Channel *this_local;
  
  pOVar1 = Op(this,0);
  Operator::Prepare(pOVar1,chip);
  pOVar1 = Op(this,1);
  Operator::Prepare(pOVar1,chip);
  pOVar1 = Op(this,2);
  Operator::Prepare(pOVar1,chip);
  pOVar1 = Op(this,3);
  Operator::Prepare(pOVar1,chip);
  pOVar1 = Op(this,4);
  Operator::Prepare(pOVar1,chip);
  pOVar1 = Op(this,5);
  Operator::Prepare(pOVar1,chip);
  for (local_2c = 0; local_2c < samples; local_2c = local_2c + 1) {
    GeneratePercussion<false>(this,chip,output + local_2c);
  }
  return this + 3;
}

Assistant:

Channel* Channel::BlockTemplate( Chip* chip, Bit32u samples, Bit32s* output ) {
	switch( mode ) {
	case sm2AM:
	case sm3AM:
		if ( Op(0)->Silent() && Op(1)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 1);
		}
		break;
	case sm2FM:
	case sm3FM:
		if ( Op(1)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 1);
		}
		break;
	case sm3FMFM:
		if ( Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm3AMFM:
		if ( Op(0)->Silent() && Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm3FMAM:
		if ( Op(1)->Silent() && Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm3AMAM:
		if ( Op(0)->Silent() && Op(2)->Silent() && Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm2Percussion:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	case sm3Percussion:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	case sm4Start:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	case sm6Start:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	}
	//Init the operators with the the current vibrato and tremolo values
	Op( 0 )->Prepare( chip );
	Op( 1 )->Prepare( chip );
	if ( mode > sm4Start ) {
		Op( 2 )->Prepare( chip );
		Op( 3 )->Prepare( chip );
	}
	if ( mode > sm6Start ) {
		Op( 4 )->Prepare( chip );
		Op( 5 )->Prepare( chip );
	}
	for ( Bitu i = 0; i < samples; i++ ) {
		//Early out for percussion handlers
		if ( mode == sm2Percussion ) {
			GeneratePercussion<false>( chip, output + i );
			continue;	//Prevent some unitialized value bitching
		} else if ( mode == sm3Percussion ) {
			GeneratePercussion<true>( chip, output + i * 2 );
			continue;	//Prevent some unitialized value bitching
		}

		//Do unsigned shift so we can shift out all bits but still stay in 10 bit range otherwise
		Bit32s mod = (Bit32u)((old[0] + old[1])) >> feedback;
		old[0] = old[1];
		old[1] = Op(0)->GetSample( mod );
		Bit32s sample;
		Bit32s out0 = old[0];
		if ( mode == sm2AM || mode == sm3AM ) {
			sample = out0 + Op(1)->GetSample( 0 );
		} else if ( mode == sm2FM || mode == sm3FM ) {
			sample = Op(1)->GetSample( out0 );
		} else if ( mode == sm3FMFM ) {
			Bits next = Op(1)->GetSample( out0 );
			next = Op(2)->GetSample( next );
			sample = Op(3)->GetSample( next );
		} else if ( mode == sm3AMFM ) {
			sample = out0;
			Bits next = Op(1)->GetSample( 0 );
			next = Op(2)->GetSample( next );
			sample += Op(3)->GetSample( next );
		} else if ( mode == sm3FMAM ) {
			sample = Op(1)->GetSample( out0 );
			Bits next = Op(2)->GetSample( 0 );
			sample += Op(3)->GetSample( next );
		} else if ( mode == sm3AMAM ) {
			sample = out0;
			Bits next = Op(1)->GetSample( 0 );
			sample += Op(2)->GetSample( next );
			sample += Op(3)->GetSample( 0 );
		}
		switch( mode ) {
		case sm2AM:
		case sm2FM:
			output[ i ] += sample;
			break;
		case sm3AM:
		case sm3FM:
		case sm3FMFM:
		case sm3AMFM:
		case sm3FMAM:
		case sm3AMAM:
			output[ i * 2 + 0 ] += sample & maskLeft;
			output[ i * 2 + 1 ] += sample & maskRight;
			break;
		case sm2Percussion:
			// This case was not handled in the DOSBox code either
			// thus we leave this blank.
			// TODO: Consider checking this.
			break;
		case sm3Percussion:
			// This case was not handled in the DOSBox code either
			// thus we leave this blank.
			// TODO: Consider checking this.
			break;
		case sm4Start:
			// This case was not handled in the DOSBox code either
			// thus we leave this blank.
			// TODO: Consider checking this.
			break;
		case sm6Start:
			// This case was not handled in the DOSBox code either
			// thus we leave this blank.
			// TODO: Consider checking this.
			break;
		}
	}
	switch( mode ) {
	case sm2AM:
	case sm2FM:
	case sm3AM:
	case sm3FM:
		return ( this + 1 );
	case sm3FMFM:
	case sm3AMFM:
	case sm3FMAM:
	case sm3AMAM:
		return( this + 2 );
	case sm2Percussion:
	case sm3Percussion:
		return( this + 3 );
	case sm4Start:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	case sm6Start:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	}
	return 0;
}